

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_60e82::SwiftCompilerShellCommand::configureBool
          (SwiftCompilerShellCommand *this,ConfigureContext *ctx,bool *to,StringRef name,
          StringRef value)

{
  bool *this_00;
  bool bVar1;
  bool local_391;
  bool local_341;
  char *local_328 [2];
  char *local_318;
  size_t local_310;
  Twine local_308;
  Twine local_2f0;
  Twine local_2d8;
  Twine local_2c0;
  Twine local_2a8;
  Twine local_290;
  Twine local_278;
  char *local_260 [2];
  char *local_250;
  size_t local_248;
  char *local_240 [2];
  char *local_230;
  size_t local_228;
  bool *local_220;
  bool *to_local;
  ConfigureContext *ctx_local;
  SwiftCompilerShellCommand *this_local;
  StringRef name_local;
  char *local_150;
  size_t local_148;
  char *local_140;
  size_t local_138;
  char *local_130;
  size_t local_128;
  char *local_120;
  size_t local_118;
  char *local_110;
  size_t local_108;
  char *local_100;
  size_t local_f8;
  char *local_f0;
  size_t local_e8;
  char **local_e0;
  char *local_d8;
  size_t local_d0;
  char **local_c8;
  char *local_c0;
  size_t local_b8;
  char **local_b0;
  char *local_a8;
  size_t local_a0;
  size_t local_98;
  char *local_90;
  char *local_88;
  int local_7c;
  size_t local_78;
  char *local_70;
  char *local_68;
  int local_5c;
  size_t local_58;
  char *local_50;
  char *local_48;
  int local_3c;
  char *local_38;
  char **local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  
  name_local.Data = (char *)name.Length;
  this_local = (SwiftCompilerShellCommand *)name.Data;
  local_230 = value.Data;
  local_228 = value.Length;
  local_30 = local_240;
  local_38 = "true";
  local_240[0] = "true";
  local_220 = to;
  to_local = (bool *)ctx;
  ctx_local = (ConfigureContext *)this;
  local_a0 = strlen("true");
  local_150 = local_230;
  local_148 = local_228;
  local_a8 = local_240[0];
  local_b0 = &local_150;
  local_341 = false;
  if (local_228 == local_a0) {
    local_88 = local_230;
    local_90 = local_240[0];
    local_98 = local_a0;
    if (local_a0 == 0) {
      local_7c = 0;
    }
    else {
      local_7c = memcmp(local_230,local_240[0],local_a0);
    }
    local_341 = local_7c == 0;
  }
  bVar1 = false;
  if (!local_341) {
    local_250 = value.Data;
    local_248 = value.Length;
    local_20 = local_260;
    local_28 = "false";
    local_260[0] = "false";
    local_138 = strlen("false");
    local_120 = local_250;
    local_118 = local_248;
    local_130 = local_260[0];
    local_140 = local_260[0];
    local_c0 = local_260[0];
    local_c8 = &local_120;
    bVar1 = false;
    local_128 = local_138;
    local_b8 = local_138;
    if (local_248 == local_138) {
      local_68 = local_250;
      local_70 = local_260[0];
      local_78 = local_138;
      if (local_138 == 0) {
        local_5c = 0;
      }
      else {
        local_5c = memcmp(local_250,local_260[0],local_138);
      }
      bVar1 = local_5c == 0;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  this_00 = to_local;
  if (bVar1) {
    llvm::operator+(&local_2c0,"invalid value: \'",&value);
    llvm::Twine::Twine(&local_2d8,"\' for attribute \'");
    llvm::operator+(&local_2a8,&local_2c0,&local_2d8);
    llvm::Twine::Twine(&local_2f0,(StringRef *)&this_local);
    llvm::operator+(&local_290,&local_2a8,&local_2f0);
    llvm::Twine::Twine(&local_308,"\'");
    llvm::operator+(&local_278,&local_290,&local_308);
    llbuild::buildsystem::ConfigureContext::error((ConfigureContext *)this_00,&local_278);
    name_local.Length._7_1_ = false;
  }
  else {
    local_318 = value.Data;
    local_310 = value.Length;
    local_10 = local_328;
    local_18 = "true";
    local_328[0] = "true";
    local_108 = strlen("true");
    local_f0 = local_318;
    local_e8 = local_310;
    local_100 = local_328[0];
    local_110 = local_328[0];
    local_d8 = local_328[0];
    local_e0 = &local_f0;
    local_391 = false;
    if (local_310 == local_108) {
      local_48 = local_318;
      local_50 = local_328[0];
      if (local_108 == 0) {
        local_3c = 0;
      }
      else {
        local_f8 = local_108;
        local_d0 = local_108;
        local_58 = local_108;
        local_3c = memcmp(local_318,local_328[0],local_108);
      }
      local_391 = local_3c == 0;
    }
    *local_220 = local_391;
    name_local.Length._7_1_ = true;
  }
  return name_local.Length._7_1_;
}

Assistant:

bool configureBool(const ConfigureContext& ctx, bool& to, StringRef name, StringRef value) {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
          name + "'");
      return false;
    }
    to = value == "true";
    return true;
  }